

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O3

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  int iVar1;
  Model *this_00;
  pointer pcVar2;
  Arena *this_01;
  Result *pRVar3;
  OneHotEncoder *this_02;
  StringVector *this_03;
  string *elem;
  int iVar4;
  pointer pbVar5;
  Rep *pRVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> element;
  long *local_60 [2];
  long local_50 [2];
  Result *local_40;
  pointer local_38;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] == 600) {
    this_02 = (this_00->Type_).onehotencoder_;
  }
  else {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    this_02 = (OneHotEncoder *)operator_new(0x28);
    Specification::OneHotEncoder::OneHotEncoder(this_02);
    (this_00->Type_).onehotencoder_ = this_02;
  }
  local_40 = __return_storage_ptr__;
  if (this_02->_oneof_case_[0] == 1) {
    if ((this_02->CategoryType_).stringcategories_ != (StringVector *)0x0) {
      (*(((this_02->CategoryType_).stringcategories_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    this_02->_oneof_case_[0] = 0;
  }
  pbVar5 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (container->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != local_38) {
    do {
      local_60[0] = local_50;
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar2,pcVar2 + pbVar5->_M_string_length);
      if (this_02->_oneof_case_[0] == 1) {
        this_03 = (this_02->CategoryType_).stringcategories_;
      }
      else {
        Specification::OneHotEncoder::clear_CategoryType(this_02);
        this_02->_oneof_case_[0] = 1;
        this_03 = (StringVector *)operator_new(0x30);
        Specification::StringVector::StringVector(this_03);
        (this_02->CategoryType_).stringcategories_ = this_03;
      }
      pRVar6 = (this_03->vector_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
        iVar4 = (this_03->vector_).super_RepeatedPtrFieldBase.total_size_;
LAB_002676d2:
        google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                  (&(this_03->vector_).super_RepeatedPtrFieldBase,iVar4 + 1);
        pRVar6 = (this_03->vector_).super_RepeatedPtrFieldBase.rep_;
        iVar4 = pRVar6->allocated_size;
LAB_002676e3:
        pRVar6->allocated_size = iVar4 + 1;
        this_01 = (this_03->vector_).super_RepeatedPtrFieldBase.arena_;
        if (this_01 == (Arena *)0x0) {
          elem = (string *)operator_new(0x20);
          *(string **)elem = elem + 0x10;
          *(long *)(elem + 8) = 0;
          elem[0x10] = (string)0x0;
        }
        else {
          elem = (string *)
                 google::protobuf::Arena::AllocateAligned
                           (this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          *(string **)elem = elem + 0x10;
          *(long *)(elem + 8) = 0;
          elem[0x10] = (string)0x0;
          google::protobuf::Arena::AddListNode
                    (this_01,elem,
                     google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
          pRVar6 = (this_03->vector_).super_RepeatedPtrFieldBase.rep_;
        }
        iVar4 = (this_03->vector_).super_RepeatedPtrFieldBase.current_size_;
        (this_03->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        pRVar6->elements[iVar4] = elem;
      }
      else {
        iVar1 = (this_03->vector_).super_RepeatedPtrFieldBase.current_size_;
        iVar4 = pRVar6->allocated_size;
        if (iVar4 <= iVar1) {
          if (iVar4 == (this_03->vector_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002676d2;
          goto LAB_002676e3;
        }
        (this_03->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        elem = (string *)pRVar6->elements[iVar1];
      }
      std::__cxx11::string::_M_assign(elem);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != local_38);
  }
  pRVar3 = local_40;
  Result::Result(local_40);
  return pRVar3;
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<std::string>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_stringcategories();
        
        for (auto element : container) {
            std::string *value = ohe->mutable_stringcategories()->add_vector();
            *value = element;
        }
        return Result();
    }